

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O2

void __thiscall nuraft::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s,ulong timeout_ms)

{
  int32 local_2c;
  __shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::mutex::lock(&this->snp_sync_ctx_lock_);
  if ((s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->snp_sync_ctx_).
                super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    local_2c = ((this->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->id_;
    std::
    make_shared<nuraft::snapshot_sync_ctx,std::shared_ptr<nuraft::snapshot>const&,int,unsigned_long&>
              ((shared_ptr<nuraft::snapshot> *)&local_28,(int *)s,(unsigned_long *)&local_2c);
    std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->snp_sync_ctx_).
                super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>,&local_28)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->snp_sync_ctx_lock_);
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s,
                              ulong timeout_ms = 10 * 1000) {
        std::lock_guard<std::mutex> l(snp_sync_ctx_lock_);
        if (s == nilptr) {
            snp_sync_ctx_.reset();
        }
        else {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s, get_id(), timeout_ms);
        }
    }